

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.cpp
# Opt level: O0

char * crnlib::pixel_format_helpers::get_pixel_format_string(pixel_format fmt)

{
  char *pcStack_10;
  pixel_format fmt_local;
  
  if (fmt == PIXEL_FMT_INVALID) {
    pcStack_10 = "INVALID";
  }
  else if (fmt == PIXEL_FMT_ETC1) {
    pcStack_10 = "ETC1";
  }
  else if (fmt == PIXEL_FMT_DXT5A) {
    pcStack_10 = "DXT5A";
  }
  else if (fmt == PIXEL_FMT_DXT1) {
    pcStack_10 = "DXT1";
  }
  else if (fmt == PIXEL_FMT_ETC2) {
    pcStack_10 = "ETC2";
  }
  else if (fmt == PIXEL_FMT_3DC) {
    pcStack_10 = "3DC";
  }
  else if (fmt == PIXEL_FMT_DXT2) {
    pcStack_10 = "DXT2";
  }
  else if (fmt == PIXEL_FMT_DXT3) {
    pcStack_10 = "DXT3";
  }
  else if (fmt == PIXEL_FMT_DXT4) {
    pcStack_10 = "DXT4";
  }
  else if (fmt == PIXEL_FMT_DXT5) {
    pcStack_10 = "DXT5";
  }
  else if (fmt == PIXEL_FMT_DXT1A) {
    pcStack_10 = "DXT1A";
  }
  else if (fmt == PIXEL_FMT_ETC2A) {
    pcStack_10 = "ETC2A";
  }
  else if (fmt == PIXEL_FMT_A8R8G8B8) {
    pcStack_10 = "A8R8G8B8";
  }
  else if (fmt == PIXEL_FMT_A8L8) {
    pcStack_10 = "A8L8";
  }
  else if (fmt == PIXEL_FMT_A8) {
    pcStack_10 = "A8";
  }
  else if (fmt == PIXEL_FMT_DXT5_AGBR) {
    pcStack_10 = "DXT5_AGBR";
  }
  else if (fmt == PIXEL_FMT_DXT5_xGBR) {
    pcStack_10 = "DXT5_xGBR";
  }
  else if (fmt == PIXEL_FMT_DXT5_xGxR) {
    pcStack_10 = "DXT5_xGxR";
  }
  else if (fmt == PIXEL_FMT_ETC1S) {
    pcStack_10 = "ETC1S";
  }
  else if (fmt == PIXEL_FMT_ETC2AS) {
    pcStack_10 = "ETC2AS";
  }
  else if (fmt == PIXEL_FMT_DXN) {
    pcStack_10 = "DXN";
  }
  else if (fmt == PIXEL_FMT_DXT5_CCxY) {
    pcStack_10 = "DXT5_CCxY";
  }
  else if (fmt == PIXEL_FMT_R8G8B8) {
    pcStack_10 = "R8G8B8";
  }
  else if (fmt == PIXEL_FMT_L8) {
    pcStack_10 = "L8";
  }
  else {
    pcStack_10 = "?";
  }
  return pcStack_10;
}

Assistant:

const char* get_pixel_format_string(pixel_format fmt)
        {
            switch (fmt)
            {
            case PIXEL_FMT_INVALID:
                return "INVALID";
            case PIXEL_FMT_DXT1:
                return "DXT1";
            case PIXEL_FMT_DXT1A:
                return "DXT1A";
            case PIXEL_FMT_DXT2:
                return "DXT2";
            case PIXEL_FMT_DXT3:
                return "DXT3";
            case PIXEL_FMT_DXT4:
                return "DXT4";
            case PIXEL_FMT_DXT5:
                return "DXT5";
            case PIXEL_FMT_3DC:
                return "3DC";
            case PIXEL_FMT_DXN:
                return "DXN";
            case PIXEL_FMT_DXT5A:
                return "DXT5A";
            case PIXEL_FMT_DXT5_CCxY:
                return "DXT5_CCxY";
            case PIXEL_FMT_DXT5_xGxR:
                return "DXT5_xGxR";
            case PIXEL_FMT_DXT5_xGBR:
                return "DXT5_xGBR";
            case PIXEL_FMT_DXT5_AGBR:
                return "DXT5_AGBR";
            case PIXEL_FMT_ETC1:
                return "ETC1";
            case PIXEL_FMT_ETC2:
                return "ETC2";
            case PIXEL_FMT_ETC2A:
                return "ETC2A";
            case PIXEL_FMT_ETC1S:
                return "ETC1S";
            case PIXEL_FMT_ETC2AS:
                return "ETC2AS";
            case PIXEL_FMT_R8G8B8:
                return "R8G8B8";
            case PIXEL_FMT_A8R8G8B8:
                return "A8R8G8B8";
            case PIXEL_FMT_A8:
                return "A8";
            case PIXEL_FMT_L8:
                return "L8";
            case PIXEL_FMT_A8L8:
                return "A8L8";
            default:
                break;
            }
            CRNLIB_ASSERT(false);
            return "?";
        }